

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O2

char * ngx_conf_set_path_slot(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_path_t **slot;
  ngx_uint_t nVar1;
  void *pvVar2;
  ngx_conf_file_t *pnVar3;
  u_char *puVar4;
  ngx_path_t *name;
  ngx_int_t nVar5;
  size_t sVar6;
  ulong uVar7;
  undefined8 *puVar8;
  char *pcStack_40;
  
  nVar1 = cmd->offset;
  if (*(long *)((long)conf + nVar1) == 0) {
    name = (ngx_path_t *)ngx_pcalloc(cf->pool,0x60);
    pcStack_40 = (char *)0xffffffffffffffff;
    if (name != (ngx_path_t *)0x0) {
      pvVar2 = cf->args->elts;
      puVar4 = *(u_char **)((long)pvVar2 + 0x18);
      (name->name).len = *(size_t *)((long)pvVar2 + 0x10);
      (name->name).data = puVar4;
      sVar6 = (name->name).len;
      if ((name->name).data[sVar6 - 1] == '/') {
        (name->name).len = sVar6 - 1;
      }
      nVar5 = ngx_conf_full_name(cf->cycle,(ngx_str_t *)name,0);
      pcStack_40 = (char *)0xffffffffffffffff;
      if (nVar5 == 0) {
        slot = (ngx_path_t **)((long)conf + nVar1);
        pnVar3 = cf->conf_file;
        name->conf_file = (pnVar3->file).name.data;
        name->line = pnVar3->line;
        puVar8 = (undefined8 *)((long)pvVar2 + 0x28);
        pcStack_40 = "invalid value";
        for (uVar7 = 10; uVar7 - 8 < cf->args->nelts; uVar7 = uVar7 + 1) {
          sVar6 = ngx_atoi((u_char *)*puVar8,puVar8[-1]);
          if (sVar6 + 1 < 2) {
            return "invalid value";
          }
          name->level[uVar7 - 10] = sVar6;
          name->len = name->len + sVar6 + 1;
          puVar8 = puVar8 + 2;
        }
        if (name->len <= uVar7) {
          *slot = name;
          nVar5 = ngx_add_path(cf,slot);
          pcStack_40 = (char *)-(ulong)(nVar5 == -1);
        }
      }
    }
  }
  else {
    pcStack_40 = "is duplicate";
  }
  return pcStack_40;
}

Assistant:

char *
ngx_conf_set_path_slot(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char  *p = conf;

    ssize_t      level;
    ngx_str_t   *value;
    ngx_uint_t   i, n;
    ngx_path_t  *path, **slot;

    slot = (ngx_path_t **) (p + cmd->offset);

    if (*slot) {
        return "is duplicate";
    }

    path = ngx_pcalloc(cf->pool, sizeof(ngx_path_t));
    if (path == NULL) {
        return NGX_CONF_ERROR;
    }

    value = cf->args->elts;

    path->name = value[1];

    if (path->name.data[path->name.len - 1] == '/') {
        path->name.len--;
    }

    if (ngx_conf_full_name(cf->cycle, &path->name, 0) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    path->conf_file = cf->conf_file->file.name.data;
    path->line = cf->conf_file->line;

    for (i = 0, n = 2; n < cf->args->nelts; i++, n++) {
        level = ngx_atoi(value[n].data, value[n].len);
        if (level == NGX_ERROR || level == 0) {
            return "invalid value";
        }

        path->level[i] = level;
        path->len += level + 1;
    }

    if (path->len > 10 + i) {
        return "invalid value";
    }

    *slot = path;

    if (ngx_add_path(cf, slot) == NGX_ERROR) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}